

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-ieee.h
# Opt level: O3

DiyFp __thiscall icu_63::double_conversion::Double::AsNormalizedDiyFp(Double *this)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  uint64_t d64;
  DiyFp DVar6;
  
  uVar1 = this->d64_;
  uVar3 = uVar1 & 0xfffffffffffff;
  if ((uVar1 & 0x7ff0000000000000) == 0) {
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    lVar4 = uVar3 << (~(byte)lVar2 + 0x35 & 0x3f);
    iVar5 = ((uint)lVar2 ^ 0xffffffc0) - 0x426;
  }
  else {
    iVar5 = ((uint)(uVar1 >> 0x34) & 0x7ff) - 0x433;
    lVar4 = uVar3 + 0x10000000000000;
  }
  DVar6.f_ = lVar4 << 0xb;
  DVar6.e_ = iVar5 + -0xb;
  DVar6._12_4_ = 0;
  return DVar6;
}

Assistant:

uint64_t AsUint64() const {
    return d64_;
  }